

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_0::formatProperties
          (TestStatus *__return_storage_ptr__,Context *context,VkFormat format)

{
  TestContext *this;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  MessageBuilder *pMVar1;
  VkFormatProperties VVar2;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  Bitfield<32UL> local_3e8;
  Bitfield<32UL> local_3d0;
  MessageBuilder local_3b8;
  uint local_238;
  uint local_234;
  VkFormatFeatureFlags required;
  VkFormatFeatureFlags supported;
  char *fieldName;
  int fieldNdx;
  MessageBuilder local_218;
  undefined8 local_98;
  anon_struct_24_3_8eb95548 fields [3];
  undefined1 auStack_48 [7];
  bool allOk;
  VkFormatFeatureFlags local_40;
  undefined1 local_38 [8];
  VkFormatProperties properties;
  TestLog *log;
  VkFormat format_local;
  Context *context_local;
  
  this = Context::getTestContext(context);
  register0x00000000 = tcu::TestContext::getLog(this);
  vk = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  VVar2 = ::vk::getPhysicalDeviceFormatProperties(vk,physicalDevice,format);
  local_40 = VVar2.bufferFeatures;
  properties.linearTilingFeatures = local_40;
  _auStack_48 = VVar2._0_8_;
  local_38._0_4_ = auStack_48._0_4_;
  local_38._4_4_ = stack0xffffffffffffffbc;
  fields[2]._23_1_ = 1;
  local_98 = 0;
  fields[0].field = (offset_in_VkFormatProperties_to_VkFormatFeatureFlags)anon_var_dwarf_1e02f6;
  fields[0].fieldName._0_4_ = 0;
  fields[0].requiredFeatures = 4;
  fields[0]._20_4_ = 0;
  fields[1].field = (offset_in_VkFormatProperties_to_VkFormatFeatureFlags)anon_var_dwarf_1e0302;
  fields[1].fieldName._0_4_ = getRequiredOptimalTilingFeatures(format);
  fields[1].requiredFeatures = 8;
  fields[1]._20_4_ = 0;
  fields[2].field = (offset_in_VkFormatProperties_to_VkFormatFeatureFlags)anon_var_dwarf_1e030e;
  fields[2].fieldName._0_4_ = getRequiredBufferFeatures(format);
  tcu::TestLog::operator<<
            (&local_218,stack0xffffffffffffffd8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_218,(VkFormatProperties *)local_38);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_218);
  for (fieldName._0_4_ = 0; (int)fieldName < 3; fieldName._0_4_ = (int)fieldName + 1) {
    _required = (char *)fields[(int)fieldName].field;
    local_234 = *(uint *)(local_38 + *(long *)&fields[(long)(int)fieldName + -1].requiredFeatures);
    local_238 = *(uint *)&fields[(int)fieldName].fieldName;
    if ((local_234 & local_238) != local_238) {
      tcu::TestLog::operator<<
                (&local_3b8,stack0xffffffffffffffd8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar1 = tcu::MessageBuilder::operator<<(&local_3b8,(char (*) [10])"ERROR in ");
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char **)&required);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [3])0x12d9f4d);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [13])"  required: ");
      ::vk::getFormatFeatureFlagsStr(&local_3d0,local_238);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_3d0);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [4])0x134da56);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [12])"  missing: ");
      ::vk::getFormatFeatureFlagsStr(&local_3e8,~local_234 & local_238);
      pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_3e8);
      tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_3b8);
      fields[2]._23_1_ = 0;
    }
  }
  if ((fields[2]._23_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"Required features not supported",&local_431);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,"Query and validation passed",&local_409);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_408);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus formatProperties (Context& context, VkFormat format)
{
	TestLog&					log				= context.getTestContext().getLog();
	const VkFormatProperties	properties		= getPhysicalDeviceFormatProperties(context.getInstanceInterface(), context.getPhysicalDevice(), format);
	bool						allOk			= true;

	const struct
	{
		VkFormatFeatureFlags VkFormatProperties::*	field;
		const char*									fieldName;
		VkFormatFeatureFlags						requiredFeatures;
	} fields[] =
	{
		{ &VkFormatProperties::linearTilingFeatures,	"linearTilingFeatures",		(VkFormatFeatureFlags)0						},
		{ &VkFormatProperties::optimalTilingFeatures,	"optimalTilingFeatures",	getRequiredOptimalTilingFeatures(format)	},
		{ &VkFormatProperties::bufferFeatures,			"buffeFeatures",			getRequiredBufferFeatures(format)			}
	};

	log << TestLog::Message << properties << TestLog::EndMessage;

	for (int fieldNdx = 0; fieldNdx < DE_LENGTH_OF_ARRAY(fields); fieldNdx++)
	{
		const char* const				fieldName	= fields[fieldNdx].fieldName;
		const VkFormatFeatureFlags		supported	= properties.*fields[fieldNdx].field;
		const VkFormatFeatureFlags		required	= fields[fieldNdx].requiredFeatures;

		if ((supported & required) != required)
		{
			log << TestLog::Message << "ERROR in " << fieldName << ":\n"
								    << "  required: " << getFormatFeatureFlagsStr(required) << "\n  "
									<< "  missing: " << getFormatFeatureFlagsStr(~supported & required)
				<< TestLog::EndMessage;
			allOk = false;
		}
	}

	if (allOk)
		return tcu::TestStatus::pass("Query and validation passed");
	else
		return tcu::TestStatus::fail("Required features not supported");
}